

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# micro_string.cc
# Opt level: O0

size_t __thiscall
google::protobuf::internal::MicroString::SpaceUsedExcludingSelfLong(MicroString *this)

{
  bool bVar1;
  LargeRepKind LVar2;
  MicroRep *pMVar3;
  LargeRep *pLVar4;
  StringRep *pSVar5;
  size_t sVar6;
  MicroString *this_local;
  
  bVar1 = is_inline(this);
  if (bVar1) {
    this_local = (MicroString *)0x0;
  }
  else {
    bVar1 = is_micro_rep(this);
    if (bVar1) {
      pMVar3 = micro_rep(this);
      this_local = (MicroString *)MicroRepSize((ulong)pMVar3->capacity);
    }
    else {
      LVar2 = large_rep_kind(this);
      switch(LVar2) {
      case kAlias:
        this_local = (MicroString *)0x10;
        break;
      case kUnowned:
        this_local = (MicroString *)0x0;
        break;
      case kString:
        pSVar5 = string_rep(this);
        sVar6 = StringSpaceUsedExcludingSelfLong(&pSVar5->str);
        this_local = (MicroString *)(sVar6 + 0x30);
        break;
      case kOwned:
        pLVar4 = large_rep(this);
        this_local = (MicroString *)((ulong)pLVar4->capacity + 0x10);
        break;
      default:
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/micro_string.cc"
                    ,0x14f);
      }
    }
  }
  return (size_t)this_local;
}

Assistant:

size_t MicroString::SpaceUsedExcludingSelfLong() const {
  if (is_inline()) return 0;
  if (is_micro_rep()) return MicroRepSize(micro_rep()->capacity);
  switch (large_rep_kind()) {
    case kOwned:
      return sizeof(LargeRep) + large_rep()->capacity;
    case kString:
      return sizeof(StringRep) +
             StringSpaceUsedExcludingSelfLong(string_rep()->str);
    case kAlias:
      return sizeof(LargeRep);
    case kUnowned:
      return 0;
  }
  Unreachable();
}